

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

char * escape_string(Curl_easy *data,char *src,mimestrategy strategy)

{
  CURLcode CVar1;
  char *pcVar2;
  char **ppcVar3;
  char **ppcVar4;
  dynbuf db;
  
  if ((strategy == MIMESTRATEGY_MAIL) ||
     ((ppcVar4 = escape_string::formtable, data != (Curl_easy *)0x0 &&
      (((data->set).field_0x8ca & 1) != 0)))) {
    ppcVar4 = escape_string::mimetable;
  }
  Curl_dyn_init(&db,8000000);
  CVar1 = Curl_dyn_addn(&db,"",0);
  do {
    if ((CVar1 != CURLE_OK) || (ppcVar3 = ppcVar4, *src == '\0')) {
      pcVar2 = Curl_dyn_ptr(&db);
      return pcVar2;
    }
    do {
      pcVar2 = *ppcVar3;
      if (pcVar2 == (char *)0x0) {
        CVar1 = Curl_dyn_addn(&db,src,1);
        goto LAB_0013c817;
      }
      ppcVar3 = ppcVar3 + 1;
    } while (*pcVar2 != *src);
    CVar1 = Curl_dyn_add(&db,pcVar2 + 1);
LAB_0013c817:
    src = src + 1;
  } while( true );
}

Assistant:

static char *escape_string(struct Curl_easy *data,
                           const char *src, enum mimestrategy strategy)
{
  CURLcode result;
  struct dynbuf db;
  const char * const *table;
  const char * const *p;
  /* replace first character by rest of string. */
  static const char * const mimetable[] = {
    "\\\\\\",
    "\"\\\"",
    NULL
  };
  /* WHATWG HTML living standard 4.10.21.8 2 specifies:
     For field names and filenames for file fields, the result of the
     encoding in the previous bullet point must be escaped by replacing
     any 0x0A (LF) bytes with the byte sequence `%0A`, 0x0D (CR) with `%0D`
     and 0x22 (") with `%22`.
     The user agent must not perform any other escapes. */
  static const char * const formtable[] = {
    "\"%22",
    "\r%0D",
    "\n%0A",
    NULL
  };

  table = formtable;
  /* data can be NULL when this function is called indirectly from
     curl_formget(). */
  if(strategy == MIMESTRATEGY_MAIL || (data && (data->set.mime_formescape)))
    table = mimetable;

  Curl_dyn_init(&db, CURL_MAX_INPUT_LENGTH);

  for(result = Curl_dyn_addn(&db, STRCONST("")); !result && *src; src++) {
    for(p = table; *p && **p != *src; p++)
      ;

    if(*p)
      result = Curl_dyn_add(&db, *p + 1);
    else
      result = Curl_dyn_addn(&db, src, 1);
  }

  return Curl_dyn_ptr(&db);
}